

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegexRuntime.cpp
# Opt level: O1

bool __thiscall
UnifiedRegex::ChompCharInst<(UnifiedRegex::ChompMode)1>::Exec
          (ChompCharInst<(UnifiedRegex::ChompMode)1> *this,Matcher *matcher,Char *input,
          CharCount inputLength,CharCount *matchStart,CharCount *inputOffset,
          CharCount *nextSyncInputOffset,uint8 **instPointer,ContStack *contStack,
          AssertionStack *assertionStack,uint *qcTicks,bool firstIteration)

{
  Char CVar1;
  Type pRVar2;
  bool bVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  
  CVar1 = (this->super_CharMixin).c;
  pRVar2 = matcher->stats;
  if (pRVar2 != (Type)0x0) {
    pRVar2->numCompares = pRVar2->numCompares + 1;
  }
  if ((*inputOffset < inputLength) && (input[*inputOffset] == CVar1)) {
    uVar4 = *inputOffset;
    uVar6 = uVar4 + 1;
    if (uVar4 + 1 < inputLength) {
      uVar6 = inputLength;
    }
    do {
      if (pRVar2 != (Type)0x0) {
        pRVar2->numCompares = pRVar2->numCompares + 1;
      }
      uVar4 = uVar4 + 1;
      uVar5 = uVar6;
    } while ((uVar4 < inputLength) && (uVar5 = uVar4, input[uVar4] == CVar1));
    *inputOffset = uVar5;
    *instPointer = *instPointer + 3;
    bVar3 = false;
  }
  else {
    bVar3 = Matcher::Fail(matcher,input,inputOffset,instPointer,contStack,assertionStack,qcTicks);
  }
  return bVar3;
}

Assistant:

inline bool ChompCharInst<Mode>::Exec(REGEX_INST_EXEC_PARAMETERS) const
    {
        const Char matchC = c;
#if ENABLE_REGEX_CONFIG_OPTIONS
        matcher.CompStats();
#endif
        if (Mode == ChompMode::Star || (inputOffset < inputLength && input[inputOffset] == matchC))
        {
            while (true)
            {
                if (Mode != ChompMode::Star)
                {
                    ++inputOffset;
                }
#if ENABLE_REGEX_CONFIG_OPTIONS
                matcher.CompStats();
#endif
                if (inputOffset < inputLength && input[inputOffset] == matchC)
                {
                    if (Mode == ChompMode::Star)
                    {
                        ++inputOffset;
                    }
                    continue;
                }
                break;
            }

            instPointer += sizeof(*this);
            return false;
        }

        return matcher.Fail(FAIL_PARAMETERS);
    }